

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint64_t bitset_flip_list_withcard(uint64_t *words,uint64_t card,uint16_t *list,uint64_t length)

{
  ushort uVar1;
  byte bVar2;
  uint16_t *end;
  uint64_t index;
  uint64_t pos;
  uint64_t newload;
  uint64_t load;
  uint64_t offset;
  uint64_t length_local;
  uint16_t *list_local;
  uint64_t card_local;
  uint64_t *words_local;
  
  list_local = (uint16_t *)card;
  for (length_local = (uint64_t)list; (uint16_t *)length_local != list + length;
      length_local = length_local + 2) {
    uVar1 = *(ushort *)length_local >> 6;
    bVar2 = (byte)*(ushort *)length_local & 0x3f;
    list_local = (uint16_t *)(((1L << bVar2 & words[uVar1]) >> bVar2) * -2 + 1 + (long)list_local);
    words[uVar1] = words[uVar1] ^ 1L << bVar2;
  }
  return (uint64_t)list_local;
}

Assistant:

uint64_t bitset_flip_list_withcard(uint64_t *words, uint64_t card,
                                   const uint16_t *list, uint64_t length) {
    uint64_t offset, load, newload, pos, index;
    const uint16_t *end = list + length;
    while (list != end) {
        pos = *list;
        offset = pos >> 6;
        index = pos % 64;
        load = words[offset];
        newload = load ^ (UINT64_C(1) << index);
        // todo: is a branch here all that bad?
        card +=
            (1 - 2 * (((UINT64_C(1) << index) & load) >> index));  // +1 or -1
        words[offset] = newload;
        list++;
    }
    return card;
}